

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegtran.c
# Opt level: O0

void my_emit_message(j_common_ptr cinfo,int msg_level)

{
  int in_ESI;
  long *in_RDI;
  
  if (in_ESI < 0) {
    (**(code **)*in_RDI)(in_RDI);
  }
  else if (in_ESI <= *(int *)(*in_RDI + 0x7c)) {
    (**(code **)(*in_RDI + 0x10))(in_RDI);
  }
  return;
}

Assistant:

METHODDEF(void)
my_emit_message(j_common_ptr cinfo, int msg_level)
{
  if (msg_level < 0) {
    /* Treat warning as fatal */
    cinfo->err->error_exit(cinfo);
  } else {
    if (cinfo->err->trace_level >= msg_level)
      cinfo->err->output_message(cinfo);
  }
}